

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O1

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getAllStrictSubTypes
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          SubTypes *this,HeapType type)

{
  pointer pHVar1;
  iterator __position;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar2;
  pointer pHVar3;
  HeapType local_60;
  HeapType type_local;
  HeapType local_50;
  HeapType sub;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> work;
  
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sub.id = 0;
  local_60.id = type.id;
  type_local.id = (uintptr_t)this;
  std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
  _M_realloc_insert<wasm::HeapType_const&>
            ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&sub,(iterator)0x0,&local_60);
  work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (sub.id != 0) {
    do {
      pHVar3 = work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start + -1;
      work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start =
           work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      pvVar2 = getStrictSubTypes((SubTypes *)type_local.id,(HeapType)pHVar3->id);
      pHVar1 = (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (pHVar3 = (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                    _M_impl.super__Vector_impl_data._M_start; pHVar3 != pHVar1; pHVar3 = pHVar3 + 1)
      {
        local_50.id = pHVar3->id;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)__return_storage_ptr__
                     ,__position,&local_50);
        }
        else {
          (__position._M_current)->id = local_50.id;
          (__return_storage_ptr__->
          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        if (work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&sub,(iterator)0x0,
                     &local_50);
        }
        else {
          (work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)local_50;
          work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start =
               work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
    } while ((pointer)sub.id !=
             work.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  if (sub.id != 0) {
    operator_delete((void *)sub.id,-sub.id);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType> getAllStrictSubTypes(HeapType type) {
    std::vector<HeapType> ret, work;
    work.push_back(type);
    while (!work.empty()) {
      auto curr = work.back();
      work.pop_back();
      for (auto sub : getStrictSubTypes(curr)) {
        ret.push_back(sub);
        work.push_back(sub);
      }
    }
    return ret;
  }